

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

void __thiscall
helics::BrokerFactory::addAssociatedBrokerType(BrokerFactory *this,string_view name,CoreType type)

{
  string sname;
  allocator<char> local_41;
  string local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (char *)name._M_len;
  local_20._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
            ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,&local_40
             ,(CoreType)name._M_str);
  addExtraTypes(&local_40,(CoreType)name._M_str);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void addAssociatedBrokerType(std::string_view name, CoreType type)
{
    const std::string sname{name};
    searchableBrokers.addType(sname, type);
    addExtraTypes(sname, type);
}